

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O0

void doubleCos1D_train<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj,int nTrain)

{
  ostream *poVar1;
  Scalar *pSVar2;
  int in_ESI;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RDI;
  result_type_conflict1 rVar3;
  double dVar4;
  int k;
  Scal zTrain;
  Vec x;
  Vec z;
  normal_distribution<double> normal;
  uniform_01<double,_double> uniform;
  mt19937 rng;
  Scal NOISE_X;
  Scal NOISE_Z;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff4f8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffff500;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  *in_stack_fffffffffffff508;
  normal_distribution<double> *in_stack_fffffffffffff510;
  int local_a5c;
  double local_a58;
  double local_a10;
  double local_a08;
  normal_distribution<double> local_a00;
  uniform_01<double,_double> local_9e9 [185];
  X *in_stack_fffffffffffff6d0;
  Z *in_stack_fffffffffffff6d8;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffff6e0;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              *)0x237977);
  boost::random::uniform_01<double,_double>::uniform_01(local_9e9);
  local_a08 = 0.0;
  local_a10 = 1.0;
  boost::random::normal_distribution<double>::normal_distribution(&local_a00,&local_a08,&local_a10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff510,
             (int *)in_stack_fffffffffffff508);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff510,
             (int *)in_stack_fffffffffffff508);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Training, y = {cos(x), cos(x)+4}, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1," training points ---");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_a58 = 0.0;
  for (local_a5c = 0; local_a5c < in_ESI; local_a5c = local_a5c + 1) {
    rVar3 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)in_stack_fffffffffffff510,in_stack_fffffffffffff508
                      );
    local_a58 = rVar3 * 0.02 + local_a58;
    if (local_a58 <= 0.0) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffff500,(Index)in_stack_fffffffffffff4f8);
      *pSVar2 = local_a58 + 12.566370614359172;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffff500,(Index)in_stack_fffffffffffff4f8);
      dVar4 = cos(*pSVar2);
      in_stack_fffffffffffff510 = (normal_distribution<double> *)(dVar4 + 4.0);
      rVar3 = boost::random::normal_distribution<double>::operator()
                        (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      in_stack_fffffffffffff500 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
           (rVar3 * 0.1 + (double)in_stack_fffffffffffff510);
      in_stack_fffffffffffff508 =
           (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
            *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        (in_stack_fffffffffffff500,(Index)in_stack_fffffffffffff4f8);
      *(DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> **)in_stack_fffffffffffff508->x =
           in_stack_fffffffffffff500;
    }
    else {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffff500,(Index)in_stack_fffffffffffff4f8);
      *pSVar2 = local_a58;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffff500,(Index)in_stack_fffffffffffff4f8);
      dVar4 = cos(*pSVar2);
      rVar3 = boost::random::normal_distribution<double>::operator()
                        (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffff500,(Index)in_stack_fffffffffffff4f8);
      *pSVar2 = rVar3 * 0.1 + dVar4;
    }
    in_stack_fffffffffffff4f8 = in_RDI;
    Eigen::Matrix<double,1,1,0,1,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffff500,in_RDI);
    Eigen::Matrix<double,1,1,0,1,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8)
    ;
    IMLE<1,_1,_FastLinearExpert>::update
              (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
    if (local_a58 <= 12.566370614359172) {
      local_a58 = local_a58 + 0.1;
    }
    else {
      local_a58 = -12.566370614359172;
    }
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x237da0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x237daf);
  return;
}

Assistant:

void doubleCos1D_train( Learner &imleObj, int nTrain = 2000)
{
    // Noise model
    const Scal NOISE_Z = 0.02;
    const Scal NOISE_X = 0.1;
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    boost::normal_distribution<Scal> normal;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Training
	cout << "\t --- Training, y = {cos(x), cos(x)+4}, " << nTrain << " training points ---" << endl;
	Scal zTrain = 0.0;
    for(int k = 0; k < nTrain; k++)
    {
        zTrain += uniform(rng) * NOISE_Z;

        if( zTrain > 0.0 )      // Lower branch
        {
            z[0] = zTrain;
            x[0] = cos(z[0]) + NOISE_X * normal(rng);
        }
        else                   // Upper branch
        {
            z[0] = zTrain + 4*M_PI;
            x[0] = cos(z[0]) + 4.0 + NOISE_X * normal(rng);
        }

        imleObj.update(z,x);

		if( zTrain > 4*M_PI )
            zTrain = -4*M_PI;
        else
            zTrain += 0.1;
    }
}